

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O2

void hbtrie_key_test(void)

{
  char *__s;
  uint uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  timeval __test_begin;
  hbtrie trie;
  char buf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  trie.chunksize = '\x04';
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    __s = (char *)(&DAT_00132cb0)[lVar3];
    sVar2 = strlen(__s);
    uVar1 = _hbtrie_reform_key(&trie,__s,(int)sVar2,buf);
    printf("keylen: %2d , ",(ulong)uVar1);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      printf("%02x ",(ulong)(byte)buf[uVar4]);
    }
    putchar(10);
  }
  fprintf(_stderr,"%s PASSED\n","hbtrie key test");
  return;
}

Assistant:

void hbtrie_key_test()
{
    TEST_INIT();

    struct hbtrie trie;
    int i,j;

    trie.chunksize = 4;

    const char *key[] = {"abc", "abcd", "abcde", "abcdef", "abcdefg", "abcdefgh"};
    char buf[256];
    int keylen;

    for (i=0;i<6;++i){
        keylen = _hbtrie_reform_key(&trie, (void*)key[i], strlen(key[i]), (void*)buf);

        DBG("keylen: %2d , ", keylen);
        for (j=0;j<keylen;++j) {
            printf("%02x ", (uint8_t)buf[j]);
        }
        printf("\n");
    }

    TEST_RESULT("hbtrie key test");
}